

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_alloter.cpp
# Opt level: O3

shared_ptr<cppnet::NormalAlloter> cppnet::MakeNormalAlloterPtr(void)

{
  _func_int **pp_Var1;
  element_type *in_RDI;
  shared_ptr<cppnet::NormalAlloter> sVar2;
  
  pp_Var1 = (_func_int **)operator_new(0x18);
  pp_Var1[1] = (_func_int *)0x100000001;
  *pp_Var1 = (_func_int *)&PTR___Sp_counted_ptr_inplace_00127b88;
  pp_Var1[2] = (_func_int *)&PTR__NormalAlloter_00127b30;
  in_RDI[1].super_Alloter._vptr_Alloter = pp_Var1;
  (in_RDI->super_Alloter)._vptr_Alloter = pp_Var1 + 2;
  sVar2.super___shared_ptr<cppnet::NormalAlloter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__NormalAlloter_00127b30;
  sVar2.super___shared_ptr<cppnet::NormalAlloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<cppnet::NormalAlloter>)
         sVar2.super___shared_ptr<cppnet::NormalAlloter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<NormalAlloter> MakeNormalAlloterPtr() {
    return std::make_shared<NormalAlloter>();
}